

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O0

Object * punky::eval::Evaluator::eval_minus_prefix_expr
                   (Object *__return_storage_ptr__,Object *right)

{
  int *piVar1;
  int local_1c;
  Object *local_18;
  Object *right_local;
  
  local_18 = right;
  right_local = __return_storage_ptr__;
  if (right->m_type == Int) {
    __return_storage_ptr__->m_type = Int;
    piVar1 = std::
             get<int,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       (&right->m_value);
    local_1c = -*piVar1;
    std::variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>::
    variant<int,void,void,int,void>
              ((variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                *)&__return_storage_ptr__->m_value,&local_1c);
  }
  else {
    unknown_op_error(__return_storage_ptr__,right);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_minus_prefix_expr(const Object& right)
{
    if (right.m_type == ObjectType::Int)
        return Object{ObjectType::Int, -std::get<int>(right.m_value)};

    return unknown_op_error(right);
}